

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_newton.c
# Opt level: O0

int SUNNonlinSolSolve_Newton
              (SUNNonlinearSolver NLS,N_Vector y0,N_Vector ycor,N_Vector w,realtype tol,
              int callLSetup,void *mem)

{
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  realtype in_R9;
  undefined8 in_XMM0_Qa;
  N_Vector delta;
  int jbad;
  int retval;
  N_Vector in_stack_ffffffffffffffa8;
  realtype c;
  uint uVar1;
  int local_34;
  int local_4;
  
  if ((((in_RDI == (long *)0x0) || (in_RSI == 0)) || (in_RDX == 0)) ||
     ((in_RCX == 0 || (in_R9 == 0.0)))) {
    local_4 = -0x385;
  }
  else if ((((*(long *)*in_RDI == 0) || (*(long *)(*in_RDI + 0x10) == 0)) ||
           ((in_R8D != 0 && (*(long *)(*in_RDI + 8) == 0)))) || (*(long *)(*in_RDI + 0x18) == 0)) {
    local_4 = -0x385;
  }
  else {
    c = *(realtype *)(*in_RDI + 0x20);
    uVar1 = 0;
    *(undefined8 *)(*in_RDI + 0x38) = 0;
    *(undefined8 *)(*in_RDI + 0x40) = 0;
    local_34 = in_R8D;
    while ((local_4 = (**(code **)*in_RDI)(in_RDX,c,in_R9), local_4 == 0 &&
           ((local_34 == 0 ||
            (local_4 = (**(code **)(*in_RDI + 8))(uVar1,*in_RDI + 0x28,in_R9), local_4 == 0))))) {
      *(undefined4 *)(*in_RDI + 0x2c) = 0;
      do {
        *(long *)(*in_RDI + 0x38) = *(long *)(*in_RDI + 0x38) + 1;
        N_VScale(c,in_stack_ffffffffffffffa8,(N_Vector)0x1178c57);
        local_4 = (**(code **)(*in_RDI + 0x10))(c,in_R9);
        if (local_4 != 0) break;
        N_VLinearSum(in_R9,(N_Vector)(ulong)uVar1,c,in_stack_ffffffffffffffa8,(N_Vector)0x1178c9e);
        local_4 = (**(code **)(*in_RDI + 0x18))
                            (in_XMM0_Qa,in_RDI,in_RDX,c,in_RCX,*(undefined8 *)(*in_RDI + 0x48));
        if (local_4 == 0) {
          *(undefined4 *)(*in_RDI + 0x28) = 0;
          return 0;
        }
        if (local_4 != 0x385) break;
        *(int *)(*in_RDI + 0x2c) = *(int *)(*in_RDI + 0x2c) + 1;
        if (*(int *)(*in_RDI + 0x30) <= *(int *)(*in_RDI + 0x2c)) {
          local_4 = 0x386;
          break;
        }
        local_4 = (**(code **)*in_RDI)(in_RDX,c,in_R9);
      } while (local_4 == 0);
      if (((local_4 < 1) || (*(int *)(*in_RDI + 0x28) != 0)) || (*(long *)(*in_RDI + 8) == 0))
      break;
      *(long *)(*in_RDI + 0x40) = *(long *)(*in_RDI + 0x40) + 1;
      local_34 = 1;
      uVar1 = 1;
      N_VConst(c,in_stack_ffffffffffffffa8);
    }
    *(long *)(*in_RDI + 0x40) = *(long *)(*in_RDI + 0x40) + 1;
  }
  return local_4;
}

Assistant:

int SUNNonlinSolSolve_Newton(SUNNonlinearSolver NLS,
                             N_Vector y0, N_Vector ycor,
                             N_Vector w, realtype tol,
                             booleantype callLSetup, void* mem)
{
  /* local variables */
  int retval;
  booleantype jbad;
  N_Vector delta;

  /* check that the inputs are non-null */
  if ( (NLS  == NULL) ||
       (y0   == NULL) ||
       (ycor == NULL) ||
       (w    == NULL) ||
       (mem  == NULL) )
    return(SUN_NLS_MEM_NULL);

  /* check that all required function pointers have been set */
  if ( (NEWTON_CONTENT(NLS)->Sys    == NULL) ||
       (NEWTON_CONTENT(NLS)->LSolve == NULL) ||
       (callLSetup && (NEWTON_CONTENT(NLS)->LSetup == NULL)) ||
       (NEWTON_CONTENT(NLS)->CTest  == NULL) ) {
    return(SUN_NLS_MEM_NULL);
  }

  /* set local shortcut variables */
  delta = NEWTON_CONTENT(NLS)->delta;

  /* assume the Jacobian is good */
  jbad = SUNFALSE;

  /* initialize iteration and convergence fail counters for this solve */
  NEWTON_CONTENT(NLS)->niters     = 0;
  NEWTON_CONTENT(NLS)->nconvfails = 0;

  /* looping point for attempts at solution of the nonlinear system:
       Evaluate the nonlinear residual function (store in delta)
       Setup the linear solver if necessary
       Preform Newton iteraion */
  for(;;) {

    /* compute the nonlinear residual, store in delta */
    retval = NEWTON_CONTENT(NLS)->Sys(ycor, delta, mem);
    if (retval != SUN_NLS_SUCCESS) break;

    /* if indicated, setup the linear system */
    if (callLSetup) {
      retval = NEWTON_CONTENT(NLS)->LSetup(jbad,
                                           &(NEWTON_CONTENT(NLS)->jcur),
                                           mem);
      if (retval != SUN_NLS_SUCCESS) break;
    }

    /* initialize current iteration counter for this solve attempt */
    NEWTON_CONTENT(NLS)->curiter = 0;

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
    /* print current iteration number and the nonlinear residual */
    if (NEWTON_CONTENT(NLS)->print_level && NEWTON_CONTENT(NLS)->info_file
        && (NEWTON_CONTENT(NLS)->info_file != NLS->sunctx->logger->info_fp))
    {
      fprintf(NEWTON_CONTENT(NLS)->info_file,
              "SUNNONLINSOL_NEWTON (nni=%ld):\n",
              (long int) NEWTON_CONTENT(NLS)->niters);
    }
    SUNLogger_QueueMsg(NLS->sunctx->logger, SUN_LOGLEVEL_INFO,
      "SUNNonlinSolSolve_Newton", "begin-iteration",
      "iter = %ld, nni = %ld", (long int) 0, NEWTON_CONTENT(NLS)->niters);
#endif

    /* looping point for Newton iteration. Break out on any error. */
    for(;;) {

      /* increment nonlinear solver iteration counter */
      NEWTON_CONTENT(NLS)->niters++;

      /* compute the negative of the residual for the linear system rhs */
      N_VScale(-ONE, delta, delta);

      /* solve the linear system to get Newton update delta */
      retval = NEWTON_CONTENT(NLS)->LSolve(delta, mem);
      if (retval != SUN_NLS_SUCCESS) break;

      /* update the Newton iterate */
      N_VLinearSum(ONE, ycor, ONE, delta, ycor);

      /* test for convergence */
      retval = NEWTON_CONTENT(NLS)->CTest(NLS, ycor, delta, tol, w,
                                          NEWTON_CONTENT(NLS)->ctest_data);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
      /* print current iteration number and the nonlinear residual */
      if (NEWTON_CONTENT(NLS)->print_level && NEWTON_CONTENT(NLS)->info_file
          && (NEWTON_CONTENT(NLS)->info_file != NLS->sunctx->logger->info_fp))
      {
        fprintf(NEWTON_CONTENT(NLS)->info_file,
                "SUNNONLINSOL_NEWTON (nni=%ld):\n",
                (long int) NEWTON_CONTENT(NLS)->niters);
      }
      SUNLogger_QueueMsg(NLS->sunctx->logger, SUN_LOGLEVEL_INFO,
        "SUNNonlinSolSolve_Newton", "end-of-iterate",
        "iter = %ld, nni = %ld, wrmsnorm = %.16g", NEWTON_CONTENT(NLS)->curiter,
        NEWTON_CONTENT(NLS)->niters, N_VWrmsNorm(delta, w));
#endif

      /* if successful update Jacobian status and return */
      if (retval == SUN_NLS_SUCCESS) {
        NEWTON_CONTENT(NLS)->jcur = SUNFALSE;
        return(SUN_NLS_SUCCESS);
      }

      /* check if the iteration should continue; otherwise exit Newton loop */
      if (retval != SUN_NLS_CONTINUE) break;

      /* not yet converged. Increment curiter and test for max allowed. */
      NEWTON_CONTENT(NLS)->curiter++;
      if (NEWTON_CONTENT(NLS)->curiter >= NEWTON_CONTENT(NLS)->maxiters) {
        retval = SUN_NLS_CONV_RECVR;
        break;
      }

      /* compute the nonlinear residual, store in delta */
      retval = NEWTON_CONTENT(NLS)->Sys(ycor, delta, mem);
      if (retval != SUN_NLS_SUCCESS) break;

    } /* end of Newton iteration loop */

    /* all errors go here */

    /* If there is a recoverable convergence failure and the Jacobian-related
       data appears not to be current, increment the convergence failure count,
       reset the initial correction to zero, and loop again with a call to
       lsetup in which jbad is TRUE. Otherwise break out and return. */
    if ((retval > 0) && !(NEWTON_CONTENT(NLS)->jcur) && (NEWTON_CONTENT(NLS)->LSetup)) {
      NEWTON_CONTENT(NLS)->nconvfails++;
      callLSetup = SUNTRUE;
      jbad = SUNTRUE;
      N_VConst(ZERO, ycor);
      continue;
    } else {
      break;
    }

  } /* end of setup loop */

  /* increment number of convergence failures */
  NEWTON_CONTENT(NLS)->nconvfails++;

  /* all error returns exit here */
  return(retval);
}